

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StructuredAssignmentPatternExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,18446744073709551615ul>,nonstd::span_lite::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,18446744073709551615ul>,nonstd::span_lite::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter_const,18446744073709551615ul>,slang::ast::Expression_const*&,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
          (BumpAllocator *this,Type *args,
          span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
          *args_1,span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                  *args_2,
          span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
          *args_3,Expression **args_4,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_5,SourceRange *args_6)

{
  Expression *defaultSetter;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  indexSetters;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elements;
  span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  *type;
  StructuredAssignmentPatternExpression *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_88;
  Expression *local_78;
  Expression *local_70;
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  local_68;
  span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  local_58;
  Expression **local_48;
  Expression **args_local_4;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *args_local_3;
  span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *args_local_2;
  span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  *args_local_1;
  Type *args_local;
  BumpAllocator *this_local;
  
  local_48 = args_4;
  args_local_4 = (Expression **)args_3;
  args_local_3 = (span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
                  *)args_2;
  args_local_2 = (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                  *)args_1;
  args_local_1 = (span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                  *)args;
  args_local = (Type *)this;
  this_00 = (StructuredAssignmentPatternExpression *)allocate(this,0x78,8);
  type = args_local_1;
  nonstd::span_lite::
  span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  ::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL,_0>
            (&local_58,
             (span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
              *)args_local_2);
  nonstd::span_lite::
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  ::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL,_0>
            (&local_68,
             (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
              *)args_local_3);
  local_78 = *args_local_4;
  local_70 = args_local_4[1];
  defaultSetter = *local_48;
  nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL,_0>(&local_88,args_5);
  indexSetters.size_ = (size_type)local_70;
  indexSetters.data_ = (pointer)local_78;
  elements.size_ = local_88.size_;
  elements.data_ = local_88.data_;
  ast::StructuredAssignmentPatternExpression::StructuredAssignmentPatternExpression
            (this_00,(Type *)type,local_58,local_68,indexSetters,defaultSetter,elements,*args_6);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }